

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O2

void and_or_test(void)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  array_container_t *array1;
  array_container_t *array2;
  array_container_t *container1;
  array_container_t *container1_00;
  array_container_t *out;
  size_t x;
  ulong uVar4;
  
  fprintf(_stderr,"--- %s\n","and_or_test");
  array1 = array_container_create();
  array2 = array_container_create();
  container1 = array_container_create();
  container1_00 = array_container_create();
  out = array_container_create();
  _assert_true((unsigned_long)array1,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x61);
  _assert_true((unsigned_long)array2,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x62);
  _assert_true((unsigned_long)container1,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,99);
  _assert_true((unsigned_long)container1_00,"BO",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,100);
  _assert_true((unsigned_long)out,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x65);
  for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + 0x11) {
    array_container_add(array1,(uint16_t)uVar4);
    array_container_add(container1,(uint16_t)uVar4);
  }
  for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + 0x3e) {
    array_container_add(array2,(uint16_t)uVar4);
    array_container_add(container1,(uint16_t)uVar4);
  }
  for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + 0x41e) {
    array_container_add(container1_00,(uint16_t)uVar4);
  }
  iVar1 = container1_00->cardinality;
  iVar2 = container1->cardinality;
  array_container_intersection(array1,array2,out);
  _assert_int_equal((long)iVar1,(long)out->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x7a);
  _Var3 = array_container_equals(container1_00,out);
  _assert_true((ulong)_Var3,"array_container_equals(BO, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x7b);
  array_container_union(array1,array2,out);
  _assert_int_equal((long)iVar2,(long)out->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x7e);
  _Var3 = array_container_equals(container1,out);
  _assert_true((ulong)_Var3,"array_container_equals(BI, TMP)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x7f);
  array_container_free(array1);
  array_container_free(array2);
  array_container_free(container1);
  array_container_free(container1_00);
  array_container_free(out);
  return;
}

Assistant:

DEFINE_TEST(and_or_test) {
    DESCRIBE_TEST;

    array_container_t* B1 = array_container_create();
    array_container_t* B2 = array_container_create();
    array_container_t* BI = array_container_create();
    array_container_t* BO = array_container_create();
    array_container_t* TMP = array_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 17) {
        array_container_add(B1, x);
        array_container_add(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        array_container_add(B2, x);
        array_container_add(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 17) {
        array_container_add(BO, x);
    }

    const int card_inter = array_container_cardinality(BO);
    const int card_union = array_container_cardinality(BI);

    array_container_intersection(B1, B2, TMP);
    assert_int_equal(card_inter, array_container_cardinality(TMP));
    assert_true(array_container_equals(BO, TMP));

    array_container_union(B1, B2, TMP);
    assert_int_equal(card_union, array_container_cardinality(TMP));
    assert_true(array_container_equals(BI, TMP));

    array_container_free(B1);
    array_container_free(B2);
    array_container_free(BI);
    array_container_free(BO);
    array_container_free(TMP);
}